

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O2

uint8_t * bstr_to_unsigned_long_long
                    (uint8_t *pBegin,uint8_t *pEnd,uint8_t base,unsigned_long_long *data)

{
  size_t delta;
  ulonglong uVar1;
  long lVar2;
  undefined7 in_register_00000011;
  size_t __n;
  char *parse_end;
  char tmp [33];
  
  parse_end = (char *)0x0;
  __n = 0x20;
  if ((ulong)((long)pEnd - (long)pBegin) < 0x20) {
    __n = (long)pEnd - (long)pBegin;
  }
  memcpy(tmp,pBegin,__n);
  tmp[__n] = '\0';
  uVar1 = strtoull(tmp,&parse_end,(int)CONCAT71(in_register_00000011,base));
  *data = uVar1;
  lVar2 = (long)parse_end - (long)tmp;
  if (parse_end < tmp || lVar2 == 0) {
    if (lVar2 == 0) {
      return pBegin;
    }
  }
  else if (pBegin + lVar2 <= pEnd) {
    return pBegin + lVar2;
  }
  return (uint8_t *)0x0;
}

Assistant:

const uint8_t* bstr_to_unsigned_long_long(const uint8_t* pBegin, const uint8_t* pEnd, uint8_t base, unsigned long long* data)
{
   char tmp[MAX_NUMBER_SIZE+1];   
   char* parse_end = NULL;
   size_t size = pEnd - pBegin;
   if (size > MAX_NUMBER_SIZE)
   {
      size = MAX_NUMBER_SIZE;
   }
   memcpy(&tmp[0], pBegin, size);
   tmp[size]='\0';
   *data = strtoull(&tmp[0], &parse_end, base);   
   if (parse_end > &tmp[0] )
   {
      size_t delta = parse_end - &tmp[0];
      const uint8_t* retval = pBegin + delta;
      if (retval <= pEnd)
      {
         return retval;
      }
   }
   else if (parse_end == &tmp[0])
   {
      return pBegin; //Not a number
   }
   return NULL;
}